

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datalogDatabase.cpp
# Opt level: O0

void __thiscall DatalogDatabase::bruteEvalRules(DatalogDatabase *this,ostream *out)

{
  size_type sVar1;
  reference ppRVar2;
  ostream *poVar3;
  void *this_00;
  ulong local_30;
  size_t k;
  int local_20;
  int nits;
  int lastTuples;
  int ntuples;
  ostream *out_local;
  DatalogDatabase *this_local;
  
  nits = totalTuples(this);
  local_20 = -1;
  k._4_4_ = 0;
  while (nits != local_20) {
    local_30 = 0;
    while( true ) {
      sVar1 = std::vector<Rule_*,_std::allocator<Rule_*>_>::size(&this->rules);
      if (sVar1 <= local_30) break;
      ppRVar2 = std::vector<Rule_*,_std::allocator<Rule_*>_>::operator[](&this->rules,local_30);
      evaluateRule(this,*ppRVar2,out);
      local_30 = local_30 + 1;
    }
    local_20 = nits;
    nits = totalTuples(this);
    k._4_4_ = k._4_4_ + 1;
  }
  poVar3 = (ostream *)std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"Converged after ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,k._4_4_);
  poVar3 = std::operator<<(poVar3," passes through the Rules.");
  this_00 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void DatalogDatabase::bruteEvalRules(ostream& out)
{
  int ntuples = totalTuples();
  int lastTuples = -1;
  int nits = 0;

  while (ntuples != lastTuples)
  {
    for (size_t k = 0; k < rules.size(); k++)
    {
      evaluateRule(rules[k], out);
    }
    lastTuples = ntuples;
    ntuples = totalTuples();
    nits++;
  }

  out << endl << "Converged after " << nits << " passes through the Rules." << endl << endl;
}